

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLUri::setPath(XMLUri *this,XMLCh *newPath)

{
  if (newPath != (XMLCh *)0x0) {
    initializePath(this,newPath);
    return;
  }
  if (this->fPath != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
  }
  this->fPath = (XMLCh *)0x0;
  if (this->fQueryString != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
  }
  this->fQueryString = (XMLCh *)0x0;
  if (this->fFragment != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
  }
  this->fFragment = (XMLCh *)0x0;
  return;
}

Assistant:

void XMLUri::setPath(const XMLCh* const newPath)
{
    if (!newPath)
    {
        if (getPath())
            fMemoryManager->deallocate(fPath);//delete [] fPath;

        fPath = 0;
        setQueryString(0);
        setFragment(0);
    }
    else
    {
        initializePath(newPath);
    }
}